

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

void Abc_RestructNodeDivisors(Abc_ManRst_t *p,Abc_Obj_t *pRoot,int nNodesSaved)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode;
  int nNodesSaved_local;
  Abc_Obj_t *pRoot_local;
  Abc_ManRst_t *p_local;
  
  Vec_PtrClear(p->vDecs);
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vLeaves);
    if (iVar1 <= local_34) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vDecs), local_34 < iVar1; local_34 = local_34 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry(p->vDecs,local_34);
        for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_38 < iVar1; local_38 = local_38 + 1
            ) {
          pObj_00 = Abc_ObjFanout(pObj,local_38);
          if (((((*(uint *)&pObj_00->field_0x14 >> 6 & 1) == 0) &&
               (iVar1 = Abc_ObjIsPo(pObj_00), iVar1 == 0)) &&
              (pAVar4 = Abc_ObjFanin0(pObj_00), (*(uint *)&pAVar4->field_0x14 >> 6 & 1) != 0)) &&
             (pAVar4 = Abc_ObjFanin1(pObj_00), (*(uint *)&pAVar4->field_0x14 >> 6 & 1) != 0)) {
            Vec_PtrPush(p->vDecs,pObj_00);
            *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xffffffbf | 0x40;
          }
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vDecs), local_34 < iVar1; local_34 = local_34 + 1) {
        pvVar3 = Vec_PtrEntry(p->vDecs,local_34);
        *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf;
      }
      iVar1 = Vec_PtrSize(p->vDecs);
      iVar2 = Vec_PtrSize(p->vLeaves);
      printf("%d\n",(ulong)(uint)((iVar1 - nNodesSaved) - iVar2));
      return;
    }
    pvVar3 = Vec_PtrEntry(p->vLeaves,local_34);
    Vec_PtrPush(p->vDecs,pvVar3);
    if ((*(uint *)((long)pvVar3 + 0x14) >> 6 & 1) != 0) break;
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf | 0x40;
    local_34 = local_34 + 1;
  }
  __assert_fail("pNode->fMarkC == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                ,0xe2,"void Abc_RestructNodeDivisors(Abc_ManRst_t *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_RestructNodeDivisors( Abc_ManRst_t * p, Abc_Obj_t * pRoot, int nNodesSaved )
{
    Abc_Obj_t * pNode, * pFanout;//, * pFanin;
    int i, k;
    // start with the leaves
    Vec_PtrClear( p->vDecs );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pNode, i )
    {
        Vec_PtrPush( p->vDecs, pNode );
        assert( pNode->fMarkC == 0 );
        pNode->fMarkC = 1;
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( pFanout->fMarkC || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_ObjFanin0(pFanout)->fMarkC && Abc_ObjFanin1(pFanout)->fMarkC )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                pFanout->fMarkC = 1;
            }
        }
    }
    // unmark the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
        pNode->fMarkC = 0;
/*
    // print the nodes
    Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDecs, pNode, i, Vec_PtrSize(p->vLeaves) )
    {
        printf( "%2d %s = ", i, Abc_NodeIsTravIdCurrent(pNode)? "*" : " " );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        printf( "\n" );
    }
*/
    printf( "%d\n", Vec_PtrSize(p->vDecs)-nNodesSaved-Vec_PtrSize(p->vLeaves) );
}